

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTcToken * __thiscall CTcPrsGramNodeOr::get_next_token(CTcPrsGramNodeOr *this)

{
  long lVar1;
  long in_RDI;
  CTcToken *tok;
  CTcToken *local_18;
  CTcToken *local_8;
  
  if ((*(byte *)(in_RDI + 0x80) & 1) == 0) {
    if ((*(byte *)(in_RDI + 0x80) >> 1 & 1) == 0) {
      local_18 = (CTcToken *)(**(code **)(**(long **)(in_RDI + 0x50) + 0x10))();
    }
    else {
      local_18 = (CTcToken *)(**(code **)(**(long **)(in_RDI + 0x50) + 0x38))();
      *(byte *)(in_RDI + 0x80) = *(byte *)(in_RDI + 0x80) & 0xfd;
    }
    if (local_18 == (CTcToken *)0x0) {
      if (*(long *)(*(long *)(in_RDI + 0x50) + 0x38) == 0) {
        local_8 = (CTcToken *)0x0;
      }
      else {
        CTcToken::settyp((CTcToken *)(in_RDI + 0x58),TOKT_OR);
        CTcToken::set_text((CTcToken *)(in_RDI + 0x58),"|",1);
        *(byte *)(in_RDI + 0x80) = *(byte *)(in_RDI + 0x80) & 0xfe | 1;
        local_8 = (CTcToken *)(in_RDI + 0x58);
      }
    }
    else {
      local_8 = local_18;
    }
  }
  else {
    *(byte *)(in_RDI + 0x80) = *(byte *)(in_RDI + 0x80) & 0xfe;
    *(undefined8 *)(in_RDI + 0x50) = *(undefined8 *)(*(long *)(in_RDI + 0x50) + 0x38);
    if (*(long *)(in_RDI + 0x50) == 0) {
      local_8 = (CTcToken *)0x0;
    }
    else {
      (**(code **)(**(long **)(in_RDI + 0x50) + 0x40))();
      lVar1 = (**(code **)(**(long **)(in_RDI + 0x50) + 0x38))();
      if (lVar1 == 0) {
        *(byte *)(in_RDI + 0x80) = *(byte *)(in_RDI + 0x80) & 0xfe | 1;
        if (*(long *)(*(long *)(in_RDI + 0x50) + 0x38) == 0) {
          local_8 = (CTcToken *)0x0;
        }
        else {
          local_8 = (CTcToken *)(in_RDI + 0x58);
        }
      }
      else {
        local_8 = (CTcToken *)(**(code **)(**(long **)(in_RDI + 0x50) + 0x38))();
      }
    }
  }
  return local_8;
}

Assistant:

const CTcToken *get_next_token()
    {
        const CTcToken *tok;

        /* 
         *   If we returned the synthesized '|' token between alternatives
         *   last time, advance to the next alternative and return its first
         *   token.  
         */
        if (just_did_or_)
        {
            /* we no longer just did an '|' */
            just_did_or_ = FALSE;
            
            /* advance to the next alternative */
            cur_alt_ = cur_alt_->next_;

            /* if there is no next alternative, there's nothing to return */
            if (cur_alt_ == 0)
                return 0;

            /* initialize the new alternative */
            cur_alt_->init_expansion();

            /* if this alternative has no subitems, return another '|' */
            if (cur_alt_->get_tok() == 0)
            {
                /* flag the '|' */
                just_did_or_ = TRUE;

                /* if this was the last alternative, we're done */
                if (cur_alt_->next_ == 0)
                    return 0;

                /* 
                 *   return the '|' again (we know it's already set up,
                 *   because we only get here if we did an '|' previously) 
                 */
                return &or_tok_;
            }

            /* return its current token */
            return cur_alt_->get_tok();
        }

        /*
         *   Get the first or next token in the current alternative,
         *   depending on where we are. 
         */
        if (before_first_)
        {
            /* we're before the first token - get the current token */
            tok = cur_alt_->get_tok();

            /* we're now past the first token */
            before_first_ = FALSE;
        }
        else
        {
            /* we're past the first token, so get the next one */
            tok = cur_alt_->get_next_token();
        }

        /* if we got a token from the current alternative, return it */
        if (tok != 0)
            return tok;

        /* 
         *   We've run out of tokens in this alternative - synthesize an OR
         *   token ('|') and return it, so the caller will know a new
         *   top-level alternative follows.
         *   
         *   Do NOT synthesize an OR token after our last alternative.  
         */
        if (cur_alt_->next_ == 0)
        {
            /* this was our last alternative - we're done */
            return 0;
        }

        /* we have another alternative - synthesize an OR */
        or_tok_.settyp(TOKT_OR);
        or_tok_.set_text("|", 1);

        /* flag that we just did an '|' */
        just_did_or_ = TRUE;

        /* return the synthesized '|' token */
        return &or_tok_;
    }